

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,OpType *op)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(*(undefined4 *)this) {
  case 0:
    pcVar1 = "xformOp:transform";
    break;
  case 1:
    pcVar1 = "xformOp:translate";
    break;
  case 2:
    pcVar1 = "xformOp:scale";
    break;
  case 3:
    pcVar1 = "xformOp:rotateX";
    break;
  case 4:
    pcVar1 = "xformOp:rotateY";
    break;
  case 5:
    pcVar1 = "xformOp:rotateZ";
    break;
  case 6:
    pcVar1 = "xformOp:rotateXYZ";
    break;
  case 7:
    pcVar1 = "xformOp:rotateXZY";
    break;
  case 8:
    pcVar1 = "xformOp:rotateYXZ";
    break;
  case 9:
    pcVar1 = "xformOp:rotateYZX";
    break;
  case 10:
    pcVar1 = "xformOp:rotateZXY";
    break;
  case 0xb:
    pcVar1 = "xformOp:rotateZYX";
    break;
  case 0xc:
    pcVar1 = "xformOp:orient";
    break;
  case 0xd:
    pcVar1 = "!resetXformStack!";
    break;
  default:
    goto switchD_002c4219_default;
  }
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
switchD_002c4219_default:
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const XformOp::OpType &op) {
  std::string ss;

  switch (op) {
    case XformOp::OpType::ResetXformStack: {
      ss = "!resetXformStack!";
      break;
    }
    case XformOp::OpType::Transform: {
      ss = "xformOp:transform";
      break;
    }
    case XformOp::OpType::Translate: {
      ss = "xformOp:translate";
      break;
    }
    case XformOp::OpType::Scale: {
      ss = "xformOp:scale";
      break;
    }
    case XformOp::OpType::RotateX: {
      ss = "xformOp:rotateX";
      break;
    }
    case XformOp::OpType::RotateY: {
      ss = "xformOp:rotateY";
      break;
    }
    case XformOp::OpType::RotateZ: {
      ss = "xformOp:rotateZ";
      break;
    }
    case XformOp::OpType::RotateXYZ: {
      ss = "xformOp:rotateXYZ";
      break;
    }
    case XformOp::OpType::RotateXZY: {
      ss = "xformOp:rotateXZY";
      break;
    }
    case XformOp::OpType::RotateYXZ: {
      ss = "xformOp:rotateYXZ";
      break;
    }
    case XformOp::OpType::RotateYZX: {
      ss = "xformOp:rotateYZX";
      break;
    }
    case XformOp::OpType::RotateZXY: {
      ss = "xformOp:rotateZXY";
      break;
    }
    case XformOp::OpType::RotateZYX: {
      ss = "xformOp:rotateZYX";
      break;
    }
    case XformOp::OpType::Orient: {
      ss = "xformOp:orient";
      break;
    }
  }

  return ss;
}